

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.c
# Opt level: O0

_Bool nuts_has_ipv6(void)

{
  int iVar1;
  nng_udp *pnStack_98;
  int rv;
  nng_udp *u;
  nng_sockaddr sa;
  
  memset(&u,0,0x88);
  u._0_2_ = 4;
  u._2_2_ = 0;
  memset((void *)((long)&u + 4),0,0x10);
  sa.s_ipc.sa_path[9] = '\x01';
  iVar1 = nng_udp_open(&stack0xffffffffffffff68,(nng_sockaddr *)&u);
  if (iVar1 == 0) {
    nng_udp_close(pnStack_98);
  }
  return iVar1 == 0;
}

Assistant:

bool
nuts_has_ipv6(void)
{
	nng_sockaddr sa = { 0 };
	nng_udp     *u;
	int          rv;

	sa.s_in6.sa_family = NNG_AF_INET6;
	sa.s_in6.sa_port   = 0;
	memset(sa.s_in6.sa_addr, 0, 16);
	sa.s_in6.sa_addr[15] = 1;

	rv = nng_udp_open(&u, &sa);
	if (rv == 0) {
		nng_udp_close(u);
	}
	return (rv == 0 ? 1 : 0);
}